

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::TriggerPromiseReactions
              (JavascriptPromiseReactionList *reactions,bool isRejecting,Var resolution,
              ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  SListNodeBase<Memory::Recycler> local_48;
  Iterator local_40;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if (reactions != (JavascriptPromiseReactionList *)0x0) {
    local_40.list =
         &reactions->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
    ;
    local_40.current = (NodeBase *)reactions;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (reactions == (JavascriptPromiseReactionList *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pSVar3 = local_40.list;
      SListNodeBase<Memory::Recycler>::Next(&local_48);
      if (local_48.next.ptr == (Type)pSVar3) break;
      SListNodeBase<Memory::Recycler>::Next(&local_48);
      local_40.current = (NodeBase *)local_48.next.ptr;
      pTVar6 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_40);
      EnqueuePromiseReactionTask((&pTVar6->resolveReaction)[isRejecting],resolution,scriptContext);
      reactions = (JavascriptPromiseReactionList *)local_40.current;
    }
  }
  return (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var JavascriptPromise::TriggerPromiseReactions(JavascriptPromiseReactionList* reactions, bool isRejecting, Var resolution, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();

        if (reactions != nullptr)
        {
            JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
            while (it.Next())
            {
                JavascriptPromiseReaction* reaction;
                if (isRejecting)
                {
                    reaction = it.Data().rejectReaction;
                }
                else
                {
                    reaction = it.Data().resolveReaction;
                }

                EnqueuePromiseReactionTask(reaction, resolution, scriptContext);
            }
        }

        return library->GetUndefined();
    }